

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

int longOptionStrcmp(poptOption *opt,char *longName,size_t longNameLen)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  char *__s;
  
  __s = opt->longName;
  uVar5 = 0;
  if (__s != (char *)0x0) {
    if ((opt->argInfo & 0x200000) != 0) {
      if ((*__s == 'n') && (__s[1] == 'o')) {
        pcVar1 = __s + 3;
        pcVar2 = __s + 2;
        __s = __s + 2;
        if (*pcVar2 == '-') {
          __s = pcVar1;
        }
      }
      if ((*longName == 'n') && (longName[1] == 'o')) {
        if (longName[2] == '-') {
          longName = longName + 3;
          longNameLen = longNameLen - 3;
        }
        else {
          longName = longName + 2;
          longNameLen = longNameLen - 2;
        }
      }
    }
    sVar4 = strlen(__s);
    if (sVar4 == longNameLen) {
      iVar3 = strncmp(__s,longName,longNameLen);
      uVar5 = (uint)(iVar3 == 0);
    }
  }
  return uVar5;
}

Assistant:

static int
longOptionStrcmp(const struct poptOption * opt,
		const char * longName, size_t longNameLen)
{
    const char * optLongName = opt->longName;
    int rc;

    if (optLongName == NULL || longName == NULL)	/* XXX can't happen */
	return 0;

    if (F_ISSET(opt, TOGGLE)) {
	if (optLongName[0] == 'n' && optLongName[1] == 'o') {
	    optLongName += sizeof("no") - 1;
	    if (optLongName[0] == '-')
		optLongName++;
	}
	if (longName[0] == 'n' && longName[1] == 'o') {
	    longName += sizeof("no") - 1;
	    longNameLen -= sizeof("no") - 1;
	    if (longName[0] == '-') {
		longName++;
		longNameLen--;
	    }
	}
    }
    rc = (int)(strlen(optLongName) == longNameLen);
    if (rc)
	rc = (int)(strncmp(optLongName, longName, longNameLen) == 0);
    return rc;
}